

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

RTPTransmissionInfo * __thiscall
jrtplib::RTPFakeTransmitter::GetTransmissionInfo(RTPFakeTransmitter *this)

{
  RTPFakeTransmissionInfo *this_00;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  if (this->init == true) {
    this_00 = (RTPFakeTransmissionInfo *)
              operator_new(0x30,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1c);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&this->localIPs);
    RTPFakeTransmissionInfo::RTPFakeTransmissionInfo
              (this_00,(list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,this->params);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_30);
  }
  else {
    this_00 = (RTPFakeTransmissionInfo *)0x0;
  }
  return &this_00->super_RTPTransmissionInfo;
}

Assistant:

RTPTransmissionInfo *RTPFakeTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPFakeTransmissionInfo(localIPs, params);
	MAINMUTEX_UNLOCK
	return tinf;
}